

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall ldc::mode(ldc *this,context *ctx,token *token,opcode *op)

{
  uint64_t bits;
  string_view prefix;
  optional<unsigned_long> oVar1;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar1 = find_in_table(token,mode::table,prefix);
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
  }
  bits = 0;
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    bits = oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload << 0x2c;
  }
  opcode::add_bits(op,bits);
  *(undefined8 *)this = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(address)
    {
        if (!equal(token, "c")) {
            return fail(token, "expected constant buffer");
        }
        token = ctx.tokenize();
        CHECK(confirm_type(token, token_type::bracket_left));

        token = ctx.tokenize();
        uint64_t value;
        CHECK(convert_integer(token, 0, max_bits(5), &value));
        op.add_bits(static_cast<uint64_t>(value) << 36);

        token = ctx.tokenize();
        CHECK(confirm_type(token, token_type::bracket_right));

        token = ctx.tokenize();
        return memory::address<true, 20, 16, 0>(ctx, token, op);
    }